

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O2

Vec3<double> * __thiscall
nanovdb::Map::applyInverseMapF<nanovdb::Vec3<double>>
          (Vec3<double> *__return_storage_ptr__,Map *this,Vec3<double> *xyz)

{
  undefined1 auVar1 [16];
  undefined1 local_28 [16];
  double local_18;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)this->mVecF;
  auVar1 = vcvtps2pd_avx(auVar1);
  local_18 = xyz->mVec[2] - (double)this->mVecF[2];
  local_28 = vsubpd_avx(*(undefined1 (*) [16])xyz->mVec,auVar1);
  matMult<nanovdb::Vec3<double>>(this->mInvMatF,(Vec3<double> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

__hostdev__ Vec3T applyInverseMapF(const Vec3T& xyz) const
    {
        return matMult(mInvMatF, Vec3T(xyz[0] - mVecF[0], xyz[1] - mVecF[1], xyz[2] - mVecF[2]));
    }